

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::SetStopTimePassed(cmCTestMultiProcessHandler *this)

{
  cmCTest *this_00;
  ostringstream cmCTestLog_msg;
  long *local_1a8;
  long local_198 [2];
  long local_188 [14];
  ios_base local_118 [264];
  
  if (this->StopTimePassed == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"The stop time has been passed. Stopping all tests.",0x32);
    std::ios::widen((char)(ostringstream *)local_188 + (char)*(undefined8 *)(local_188[0] + -0x18));
    std::ostream::put((char)local_188);
    std::ostream::flush();
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0xda,(char *)local_1a8,false);
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
    this->StopTimePassed = true;
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetStopTimePassed()
{
  if (!this->StopTimePassed) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "The stop time has been passed. "
               "Stopping all tests."
                 << std::endl);
    this->StopTimePassed = true;
  }
}